

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpl_model.c
# Opt level: O0

double get_frame_importance(TplParams *tpl_data,int gf_frame_index)

{
  int stride;
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int in_ESI;
  long in_RDI;
  double dVar8;
  double dVar9;
  double dist_scaled;
  int64_t mc_dep_delta;
  double cbcmp;
  TplDepStats *this_stats;
  int col;
  int row;
  int step;
  double cbcmp_base;
  double mc_dep_cost_base;
  double intra_cost_base;
  int tpl_stride;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  undefined8 local_80;
  undefined4 local_4c;
  undefined4 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  lVar6 = *(long *)(in_RDI + 0x4ff0) + (long)in_ESI * 0x60;
  lVar1 = *(long *)(lVar6 + 8);
  stride = *(int *)(lVar6 + 0x40);
  local_30 = 0.0;
  local_38 = 0.0;
  local_40 = 1.0;
  iVar4 = 1 << (*(byte *)(in_RDI + 4) & 0x1f);
  for (local_48 = 0; local_48 < *(int *)(lVar6 + 0x4c); local_48 = iVar4 + local_48) {
    for (local_4c = 0; local_4c < *(int *)(lVar6 + 0x50); local_4c = iVar4 + local_4c) {
      iVar5 = av1_tpl_ptr_pos(local_48,local_4c,stride,*(uint8_t *)(in_RDI + 4));
      lVar7 = lVar1 + (long)iVar5 * 200;
      dVar8 = (double)*(long *)(lVar7 + 8);
      lVar2 = *(long *)(lVar7 + 0x40);
      iVar5 = *(int *)(lVar6 + 0x54);
      lVar3 = *(long *)(lVar7 + 0x48);
      local_80 = (double)(*(long *)(lVar7 + 0x18) << 7);
      if (local_80 <= 1.0) {
        local_80 = 1.0;
      }
      dVar9 = log(local_80);
      local_30 = dVar9 * dVar8 + local_30;
      dVar9 = log(local_80 + (double)((lVar2 * iVar5 + 0x100 >> 9) + lVar3 * 0x80));
      local_38 = dVar9 * dVar8 + local_38;
      local_40 = dVar8 + local_40;
    }
  }
  dVar8 = exp((local_38 - local_30) / local_40);
  return dVar8;
}

Assistant:

static double get_frame_importance(const TplParams *tpl_data,
                                   int gf_frame_index) {
  const TplDepFrame *tpl_frame = &tpl_data->tpl_frame[gf_frame_index];
  const TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  const int tpl_stride = tpl_frame->stride;
  double intra_cost_base = 0;
  double mc_dep_cost_base = 0;
  double cbcmp_base = 1;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  for (int row = 0; row < tpl_frame->mi_rows; row += step) {
    for (int col = 0; col < tpl_frame->mi_cols; col += step) {
      const TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];
      double cbcmp = (double)this_stats->srcrf_dist;
      const int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      dist_scaled = AOMMAX(dist_scaled, 1);
      intra_cost_base += log(dist_scaled) * cbcmp;
      mc_dep_cost_base += log(dist_scaled + mc_dep_delta) * cbcmp;
      cbcmp_base += cbcmp;
    }
  }
  return exp((mc_dep_cost_base - intra_cost_base) / cbcmp_base);
}